

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::PatchGetValueUsingSpecifiedInlineCache
              (InlineCache *inlineCache,Var instance,RecyclableObject *object,PropertyId propertyId,
              ScriptContext *scriptContext)

{
  bool bVar1;
  InlineCache *local_80;
  Var value;
  PropertyValueInfo info;
  ScriptContext *scriptContext_local;
  PropertyId propertyId_local;
  RecyclableObject *object_local;
  Var instance_local;
  InlineCache *inlineCache_local;
  
  info._56_8_ = scriptContext;
  PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)&value);
  PropertyValueInfo::SetCacheInfo((PropertyValueInfo *)&value,inlineCache);
  bVar1 = CacheOperators::TryGetProperty<true,true,true,true,false,true,true,false,false,false>
                    (instance,false,object,propertyId,&local_80,(ScriptContext *)info._56_8_,
                     (PropertyCacheOperationInfo *)0x0,(PropertyValueInfo *)&value);
  if (bVar1) {
    inlineCache_local = local_80;
  }
  else {
    bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,InlineCachePhase);
    if ((bVar1) && ((DAT_01ec73ca & 1) != 0)) {
      CacheOperators::TraceCache
                (inlineCache,L"PatchGetValue",propertyId,(ScriptContext *)info._56_8_,object);
    }
    inlineCache_local =
         (InlineCache *)
         GetProperty(instance,object,propertyId,(ScriptContext *)info._56_8_,
                     (PropertyValueInfo *)&value);
  }
  return inlineCache_local;
}

Assistant:

Var JavascriptOperators::PatchGetValueUsingSpecifiedInlineCache(InlineCache * inlineCache, Var instance, RecyclableObject * object, PropertyId propertyId, ScriptContext* scriptContext)
    {
        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, inlineCache);
        Var value;
        if (CacheOperators::TryGetProperty<true, true, true, true, false, true, !InlineCache::IsPolymorphic, InlineCache::IsPolymorphic, false, false>(
                instance, false, object, propertyId, &value, scriptContext, nullptr, &info))
        {
            return value;
        }

#if DBG_DUMP
        if (PHASE_VERBOSE_TRACE1(Js::InlineCachePhase))
        {
            CacheOperators::TraceCache(inlineCache, _u("PatchGetValue"), propertyId, scriptContext, object);
        }
#endif

        return JavascriptOperators::GetProperty(instance, object, propertyId, scriptContext, &info);
    }